

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O2

bool __thiscall
Js::JavascriptFunction::GetSetterBuiltIns
          (JavascriptFunction *this,PropertyId propertyId,Var *setterValue,PropertyValueInfo *info,
          ScriptContext *requestContext,DescriptorFlags *descriptorFlags)

{
  code *pcVar1;
  DescriptorFlags DVar2;
  bool bVar3;
  undefined4 *puVar4;
  JavascriptMethod p_Var5;
  
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0xa1d,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) goto LAB_00a8ac3f;
    *puVar4 = 0;
  }
  if (setterValue == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0xa1e,"(setterValue)","setterValue");
    if (!bVar3) goto LAB_00a8ac3f;
    *puVar4 = 0;
  }
  if (requestContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0xa1f,"(requestContext)","requestContext");
    if (!bVar3) {
LAB_00a8ac3f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (((propertyId | 2U) == 0x1cf) && (bVar3 = HasRestrictedProperties(this), bVar3)) {
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = (RecyclableObject *)this;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
    p_Var5 = RecyclableObject::GetEntryPoint((RecyclableObject *)this);
    if (p_Var5 == PrototypeEntryPoint) {
      *setterValue = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                     super_JavascriptLibraryBase).throwTypeErrorRestrictedPropertyAccessorFunction.
                     ptr;
      DVar2 = Accessor;
    }
    else {
      DVar2 = Data;
    }
    *descriptorFlags = DVar2;
    return true;
  }
  return false;
}

Assistant:

bool JavascriptFunction::GetSetterBuiltIns(PropertyId propertyId, Var *setterValue, PropertyValueInfo* info, ScriptContext* requestContext, DescriptorFlags* descriptorFlags)
    {
        Assert(propertyId != Constants::NoProperty);
        Assert(setterValue);
        Assert(requestContext);

        switch (propertyId)
        {
        case PropertyIds::caller:
        case PropertyIds::arguments:
            if (this->HasRestrictedProperties()) {
                PropertyValueInfo::SetNoCache(info, this);
                if (this->GetEntryPoint() == JavascriptFunction::PrototypeEntryPoint)
                {
                    *setterValue = requestContext->GetLibrary()->GetThrowTypeErrorRestrictedPropertyAccessorFunction();
                    *descriptorFlags = Accessor;
                }
                else
                {
                    *descriptorFlags = Data;
                }
                return true;
            }
            break;
        }

        return false;
    }